

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_mountMemory(void *buf,PHYSFS_uint64 len,_func_void_void_ptr *del,char *fname,
                      char *mountPoint,int appendToPath)

{
  PHYSFS_Io *io_00;
  MemoryIoInfo *info;
  PHYSFS_Io *io;
  int retval;
  int appendToPath_local;
  char *mountPoint_local;
  char *fname_local;
  _func_void_void_ptr *del_local;
  PHYSFS_uint64 len_local;
  void *buf_local;
  
  if (buf == (void *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    buf_local._4_4_ = 0;
  }
  else if (fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    buf_local._4_4_ = 0;
  }
  else {
    io_00 = __PHYSFS_createMemoryIo(buf,len,del);
    if (io_00 == (PHYSFS_Io *)0x0) {
      buf_local._4_4_ = 0;
    }
    else {
      buf_local._4_4_ = doMount(io_00,fname,mountPoint,appendToPath);
      if (buf_local._4_4_ == 0) {
        *(undefined8 *)((long)io_00->opaque + 0x28) = 0;
        (*io_00->destroy)(io_00);
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int PHYSFS_mountMemory(const void *buf, PHYSFS_uint64 len, void (*del)(void *),
                       const char *fname, const char *mountPoint,
                       int appendToPath)
{
    int retval = 0;
    PHYSFS_Io *io = NULL;

    BAIL_IF(!buf, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    io = __PHYSFS_createMemoryIo(buf, len, del);
    BAIL_IF_ERRPASS(!io, 0);
    retval = doMount(io, fname, mountPoint, appendToPath);
    if (!retval)
    {
        /* docs say not to call (del) in case of failure, so cheat. */
        MemoryIoInfo *info = (MemoryIoInfo *) io->opaque;
        info->destruct = NULL;
        io->destroy(io);
    } /* if */

    return retval;
}